

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_srst(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 arg2;
  TCGv_i32 arg3;
  TCGv_i32 r2;
  TCGv_i32 r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  arg2 = tcg_const_i32_s390x(tcg_ctx_00,iVar1);
  iVar1 = get_field1(s,FLD_O_r2,FLD_C_b2);
  arg3 = tcg_const_i32_s390x(tcg_ctx_00,iVar1);
  gen_helper_srst(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_srst(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 r1 = tcg_const_i32(tcg_ctx, get_field(s, r1));
    TCGv_i32 r2 = tcg_const_i32(tcg_ctx, get_field(s, r2));

    gen_helper_srst(tcg_ctx, tcg_ctx->cpu_env, r1, r2);

    tcg_temp_free_i32(tcg_ctx, r1);
    tcg_temp_free_i32(tcg_ctx, r2);
    set_cc_static(s);
    return DISAS_NEXT;
}